

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prime_test.cpp
# Opt level: O3

void __thiscall ISPRIME_Negative_Test::TestBody(ISPRIME_Negative_Test *this)

{
  void *pvVar1;
  long *plVar2;
  bool bVar3;
  char *message;
  initializer_list<bool> __l;
  initializer_list<bool> __l_00;
  vector<bool,_std::allocator<bool>_> local_80;
  vector<bool,_std::allocator<bool>_> local_58;
  allocator_type local_30 [8];
  AssertionResult gtest_ar;
  allocator_type local_11;
  
  local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p._0_1_ = isprime(-1);
  local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p._1_1_ = isprime(-0x1475);
  local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p._2_1_ = isprime(-0xefedb1);
  local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p._3_1_ = isprime(-2);
  __l._M_len = 4;
  __l._M_array = (iterator)&local_58;
  std::vector<bool,_std::allocator<bool>_>::vector(&local_80,__l,local_30);
  gtest_ar.message_.ptr_._0_4_ = 0;
  __l_00._M_len = 4;
  __l_00._M_array = (iterator)&gtest_ar.message_;
  std::vector<bool,_std::allocator<bool>_>::vector(&local_58,__l_00,&local_11);
  testing::internal::
  CmpHelperEQ<std::vector<bool,std::allocator<bool>>,std::vector<bool,std::allocator<bool>>>
            ((internal *)local_30,"res","(vector<bool> {false, false, false, false})",&local_80,
             &local_58);
  pvVar1 = (void *)CONCAT44(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._4_4_,
                            CONCAT13(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                                     ._3_1_,CONCAT12(local_58.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_start.
                                                  super__Bit_iterator_base._M_p._2_1_,
                                                  CONCAT11(local_58.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_start.
                                                  super__Bit_iterator_base._M_p._1_1_,
                                                  local_58.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_start.
                                                  super__Bit_iterator_base._M_p._0_1_))));
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1);
  }
  if (local_30[0] == (allocator_type)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (gtest_ar._0_8_ == 0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/trinerdi[P]icpc-notebook/src/trinerdi/number-theory/prime_test.cpp"
               ,7,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar.message_,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    if (CONCAT44(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._4_4_,
                 CONCAT13(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._3_1_,
                          CONCAT12(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p.
                                   _2_1_,CONCAT11(local_58.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_start.
                                                  super__Bit_iterator_base._M_p._1_1_,
                                                  local_58.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_start.
                                                  super__Bit_iterator_base._M_p._0_1_)))) != 0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         (plVar2 = (long *)CONCAT44(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p.
                                    _4_4_,CONCAT13(local_58.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_start.
                                                  super__Bit_iterator_base._M_p._3_1_,
                                                  CONCAT12(local_58.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_start.
                                                  super__Bit_iterator_base._M_p._2_1_,
                                                  CONCAT11(local_58.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_start.
                                                  super__Bit_iterator_base._M_p._1_1_,
                                                  local_58.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_start.
                                                  super__Bit_iterator_base._M_p._0_1_)))),
         plVar2 != (long *)0x0)) {
        (**(code **)(*plVar2 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return;
}

Assistant:

TEST(ISPRIME, Negative) {
	vector<bool> res = {isprime(-1), isprime(-5237), isprime(-15723953), isprime(-2)};
	EXPECT_EQ(res, (vector<bool> {false, false, false, false}));
}